

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

btScalar btSoftBody::RayFromToCaster::rayFromToTriangle
                   (btVector3 *rayFrom,btVector3 *rayTo,btVector3 *rayNormalizedDirection,
                   btVector3 *a,btVector3 *b,btVector3 *c,btScalar maxt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar3 = a->m_floats[0];
  fVar7 = a->m_floats[1];
  fVar12 = b->m_floats[1] - fVar7;
  fVar8 = a->m_floats[2];
  fVar4 = b->m_floats[2] - fVar8;
  fVar1 = c->m_floats[0] - fVar3;
  fVar6 = c->m_floats[1] - fVar7;
  fVar2 = c->m_floats[2] - fVar8;
  fVar13 = fVar12 * fVar2 - fVar6 * fVar4;
  fVar5 = b->m_floats[0] - fVar3;
  fVar2 = fVar4 * fVar1 - fVar2 * fVar5;
  fVar4 = fVar6 * fVar5 - fVar1 * fVar12;
  fVar1 = rayNormalizedDirection->m_floats[2] * fVar4 +
          rayNormalizedDirection->m_floats[0] * fVar13 + rayNormalizedDirection->m_floats[1] * fVar2
  ;
  if (1.1920929e-07 <= ABS(fVar1)) {
    fVar1 = -((fVar4 * rayFrom->m_floats[2] +
              fVar13 * rayFrom->m_floats[0] + rayFrom->m_floats[1] * fVar2) -
             (fVar4 * fVar8 + fVar13 * fVar3 + fVar7 * fVar2)) / fVar1;
    if ((1.1920929e-06 < fVar1) && (fVar1 < maxt)) {
      fVar12 = rayFrom->m_floats[0] + rayNormalizedDirection->m_floats[0] * fVar1;
      fVar5 = rayFrom->m_floats[1] + rayNormalizedDirection->m_floats[1] * fVar1;
      fVar6 = rayFrom->m_floats[2] + rayNormalizedDirection->m_floats[2] * fVar1;
      fVar3 = fVar3 - fVar12;
      fVar7 = fVar7 - fVar5;
      fVar8 = fVar8 - fVar6;
      fVar11 = b->m_floats[0] - fVar12;
      fVar10 = b->m_floats[1] - fVar5;
      fVar9 = b->m_floats[2] - fVar6;
      if (-1.1920929e-06 <
          (fVar3 * fVar10 - fVar11 * fVar7) * fVar4 +
          (fVar7 * fVar9 - fVar10 * fVar8) * fVar13 + (fVar8 * fVar11 - fVar9 * fVar3) * fVar2) {
        fVar12 = c->m_floats[0] - fVar12;
        fVar5 = c->m_floats[1] - fVar5;
        fVar6 = c->m_floats[2] - fVar6;
        if ((-1.1920929e-06 <
             (fVar11 * fVar5 - fVar12 * fVar10) * fVar4 +
             (fVar10 * fVar6 - fVar5 * fVar9) * fVar13 + (fVar9 * fVar12 - fVar6 * fVar11) * fVar2)
           && (-1.1920929e-06 <
               fVar4 * (fVar12 * fVar7 - fVar3 * fVar5) +
               fVar13 * (fVar5 * fVar8 - fVar7 * fVar6) + fVar2 * (fVar6 * fVar3 - fVar8 * fVar12)))
        {
          return fVar1;
        }
      }
    }
  }
  return -1.0;
}

Assistant:

btScalar			btSoftBody::RayFromToCaster::rayFromToTriangle(	const btVector3& rayFrom,
																   const btVector3& rayTo,
																   const btVector3& rayNormalizedDirection,
																   const btVector3& a,
																   const btVector3& b,
																   const btVector3& c,
																   btScalar maxt)
{
	static const btScalar	ceps=-SIMD_EPSILON*10;
	static const btScalar	teps=SIMD_EPSILON*10;

	const btVector3			n=btCross(b-a,c-a);
	const btScalar			d=btDot(a,n);
	const btScalar			den=btDot(rayNormalizedDirection,n);
	if(!btFuzzyZero(den))
	{
		const btScalar		num=btDot(rayFrom,n)-d;
		const btScalar		t=-num/den;
		if((t>teps)&&(t<maxt))
		{
			const btVector3	hit=rayFrom+rayNormalizedDirection*t;
			if(	(btDot(n,btCross(a-hit,b-hit))>ceps)	&&			
				(btDot(n,btCross(b-hit,c-hit))>ceps)	&&
				(btDot(n,btCross(c-hit,a-hit))>ceps))
			{
				return(t);
			}
		}
	}
	return(-1);
}